

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

int make_user_callback(void *data,int nr_cols,char **field,char **colName)

{
  char ***__nptr;
  int *piVar1;
  long lVar2;
  undefined8 uVar3;
  string username;
  string bio;
  string password;
  string alias;
  allocator local_b5;
  int local_b4;
  char ***local_b0 [2];
  char **local_a0 [2];
  char ***local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char ***local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_b0,*field,(allocator *)&local_90);
  __nptr = local_b0[0];
  piVar1 = __errno_location();
  local_b4 = *piVar1;
  *piVar1 = 0;
  lVar2 = strtol((char *)__nptr,(char **)&local_50,10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar2 == lVar2) && (*piVar1 != 0x22)) {
    if (*piVar1 == 0) {
      *piVar1 = local_b4;
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    std::__cxx11::string::string((string *)local_b0,field[1],(allocator *)&local_50);
    local_48 = 0;
    local_40[0] = 0;
    local_50 = (char ***)local_40;
    if (field[2] != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_90,field[2],(allocator *)local_70);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
      if (local_90 != (char ***)local_80) {
        operator_delete(local_90);
      }
    }
    local_88 = 0;
    local_80[0] = 0;
    local_90 = (char ***)local_80;
    if (field[3] != (char *)0x0) {
      std::__cxx11::string::string((string *)local_70,field[3],&local_b5);
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    std::__cxx11::string::string((string *)local_70,field[4],&local_b5);
    *(int *)data = (int)lVar2;
    std::__cxx11::string::_M_assign((string *)((long)data + 8));
    std::__cxx11::string::_M_assign((string *)((long)data + 0x28));
    std::__cxx11::string::_M_assign((string *)((long)data + 0x48));
    std::__cxx11::string::_M_assign((string *)((long)data + 0x68));
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (local_90 != (char ***)local_80) {
      operator_delete(local_90);
    }
    if (local_50 != (char ***)local_40) {
      operator_delete(local_50);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    return 0;
  }
  uVar3 = std::__throw_out_of_range("stoi");
  if (local_90 != __nptr) {
    operator_delete(local_90);
  }
  if ((char ****)local_50 != &local_50) {
    operator_delete(local_50);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  __cxa_begin_catch(uVar3);
  __cxa_end_catch();
  return 1;
}

Assistant:

static int make_user_callback(void *data, int nr_cols, char **field, char **colName)
{
	User* result = static_cast<User*>(data);
	try
	{
		int id = std::stoi(field[0]);
		std::string username(field[1]);
		std::string alias;
		if (field[2] != nullptr)
			alias = std::string(field[2]);
		std::string bio;
		if (field[3] != nullptr)
			bio = std::string(field[3]);
		std::string password(field[4]);

		result->setId(id);
		result->setUsername(username);
		result->setAlias(alias);
		result->setBio(bio);
		result->setPassword(password);
	}
	catch (...)
	{
		return 1;
	}

	return 0;
}